

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O0

CHUNKcode Curl_httpchunk_read(Curl_easy *data,char *datap,ssize_t datalen,ssize_t *wrotep,
                             CURLcode *extrap)

{
  CURLcode CVar1;
  int iVar2;
  CURLofft CVar3;
  char *pcVar4;
  size_t sVar5;
  size_t *local_98;
  size_t trlen;
  char *tr;
  char *endptr;
  size_t *wrote;
  curl_off_t length;
  size_t piece;
  SingleRequest *k;
  Curl_chunker *ch;
  connectdata *conn;
  CURLcode *pCStack_38;
  CURLcode result;
  CURLcode *extrap_local;
  ssize_t *wrotep_local;
  ssize_t datalen_local;
  char *datap_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  ch = (Curl_chunker *)data->conn;
  k = (SingleRequest *)&((connectdata *)ch)->chunk;
  piece = (size_t)&data->req;
  *wrotep = 0;
  endptr = (char *)wrotep;
  wrote = (size_t *)datalen;
  pCStack_38 = extrap;
  extrap_local = (CURLcode *)wrotep;
  wrotep_local = (ssize_t *)datalen;
  datalen_local = (ssize_t)datap;
  datap_local = (char *)data;
  if ((((*(ulong *)&(data->set).field_0x9a0 >> 0x26 & 1) != 0) &&
      ((*(ushort *)&(data->req).field_0xd8 >> 3 & 1) == 0)) &&
     (CVar1 = Curl_client_write(data,1,datap,datalen), CVar1 != CURLE_OK)) {
    *pCStack_38 = CVar1;
    return CHUNKE_PASSTHRU_ERROR;
  }
  conn._4_4_ = CURLE_OK;
  do {
    if (wrote == (size_t *)0x0) {
      return CHUNKE_OK;
    }
    switch((int)k->maxdownload) {
    case 0:
      iVar2 = Curl_isxdigit((int)*(char *)datalen_local);
      if (iVar2 == 0) {
        if (*(char *)((long)&k->maxdownload + 4) == '\0') {
          return CHUNKE_ILLEGAL_HEX;
        }
        *(undefined1 *)((long)&k->maxdownload + (ulong)*(byte *)((long)&k->maxdownload + 4) + 5) = 0
        ;
        conn._4_4_ = CURLE_OK;
        CVar3 = curlx_strtoofft((char *)((long)&k->maxdownload + 5),&tr,0x10,&k->size);
        if (CVar3 != CURL_OFFT_OK) {
          return CHUNKE_ILLEGAL_HEX;
        }
        *(undefined4 *)&k->maxdownload = 1;
      }
      else {
        if (0xf < *(byte *)((long)&k->maxdownload + 4)) {
          return CHUNKE_TOO_LONG_HEX;
        }
        *(undefined1 *)((long)&k->maxdownload + (ulong)*(byte *)((long)&k->maxdownload + 4) + 5) =
             *(undefined1 *)datalen_local;
        datalen_local = datalen_local + 1;
        wrote = (size_t *)((long)wrote + -1);
        *(char *)((long)&k->maxdownload + 4) = *(char *)((long)&k->maxdownload + 4) + '\x01';
      }
      break;
    case 1:
      if (*(char *)datalen_local == '\n') {
        if (k->size == 0) {
          *(undefined4 *)&k->maxdownload = 5;
        }
        else {
          *(undefined4 *)&k->maxdownload = 2;
        }
      }
      datalen_local = datalen_local + 1;
      wrote = (size_t *)((long)wrote + -1);
      break;
    case 2:
      if (k->size < (long)wrote) {
        local_98 = (size_t *)k->size;
      }
      else {
        local_98 = wrote;
      }
      length = curlx_sotouz((curl_off_t)local_98);
      if (((*(ulong *)(datap_local + 0xb50) >> 0x26 & 1) == 0) &&
         ((*(ushort *)(piece + 0xd8) >> 3 & 1) == 0)) {
        if (((*(ulong *)(datap_local + 0xb50) >> 0x27 & 1) == 0) && (*(long *)(piece + 0x90) != 0))
        {
          conn._4_4_ = Curl_unencode_write((Curl_easy *)datap_local,
                                           *(contenc_writer **)(piece + 0x90),(char *)datalen_local,
                                           length);
        }
        else {
          conn._4_4_ = Curl_client_write((Curl_easy *)datap_local,1,(char *)datalen_local,length);
        }
        if (conn._4_4_ != CURLE_OK) {
          *pCStack_38 = conn._4_4_;
          return CHUNKE_PASSTHRU_ERROR;
        }
      }
      *(curl_off_t *)endptr = length + *(long *)endptr;
      k->size = k->size - length;
      datalen_local = length + datalen_local;
      wrote = (size_t *)((long)wrote - length);
      if (k->size == 0) {
        *(undefined4 *)&k->maxdownload = 3;
      }
      break;
    case 3:
      if (*(char *)datalen_local == '\n') {
        Curl_httpchunk_init((Curl_easy *)datap_local);
      }
      else if (*(char *)datalen_local != '\r') {
        return CHUNKE_BAD_CHUNK;
      }
      datalen_local = datalen_local + 1;
      wrote = (size_t *)((long)wrote + -1);
      break;
    case 4:
      if (*(char *)datalen_local == '\n') {
        wrote = (size_t *)((long)wrote + -1);
        sVar5 = curlx_sotouz((curl_off_t)wrote);
        k->size = sVar5;
        return CHUNKE_STOP;
      }
      return CHUNKE_BAD_CHUNK;
    case 5:
      if ((*(char *)datalen_local == '\r') || (*(char *)datalen_local == '\n')) {
        pcVar4 = Curl_dyn_ptr((dynbuf *)(ch[0x21].hexbuffer + 0xb));
        if (pcVar4 == (char *)0x0) {
          *(undefined4 *)&k->maxdownload = 7;
          break;
        }
        conn._4_4_ = Curl_dyn_add((dynbuf *)(ch[0x21].hexbuffer + 0xb),"\r\n");
        if (conn._4_4_ != CURLE_OK) {
          return CHUNKE_OUT_OF_MEMORY;
        }
        pcVar4 = Curl_dyn_ptr((dynbuf *)(ch[0x21].hexbuffer + 0xb));
        sVar5 = Curl_dyn_len((dynbuf *)(ch[0x21].hexbuffer + 0xb));
        conn._4_4_ = 0;
        if (((*(ulong *)(datap_local + 0xb50) >> 0x26 & 1) == 0) &&
           (CVar1 = Curl_client_write((Curl_easy *)datap_local,2,pcVar4,sVar5), CVar1 != CURLE_OK))
        {
          *pCStack_38 = CVar1;
          return CHUNKE_PASSTHRU_ERROR;
        }
        conn._4_4_ = CURLE_OK;
        Curl_dyn_reset((dynbuf *)(ch[0x21].hexbuffer + 0xb));
        *(undefined4 *)&k->maxdownload = 6;
        if (*(char *)datalen_local == '\n') break;
      }
      else {
        CVar1 = Curl_dyn_addn((dynbuf *)(ch[0x21].hexbuffer + 0xb),(void *)datalen_local,1);
        if (CVar1 != CURLE_OK) {
          return CHUNKE_OUT_OF_MEMORY;
        }
        conn._4_4_ = CURLE_OK;
      }
      datalen_local = datalen_local + 1;
      wrote = (size_t *)((long)wrote + -1);
      break;
    case 6:
      if (*(char *)datalen_local != '\n') {
        return CHUNKE_BAD_CHUNK;
      }
      *(undefined4 *)&k->maxdownload = 7;
      datalen_local = datalen_local + 1;
      wrote = (size_t *)((long)wrote + -1);
      break;
    case 7:
      if ((*(char *)datalen_local == '\r') || (*(char *)datalen_local == '\n')) {
        if (*(char *)datalen_local == '\r') {
          datalen_local = datalen_local + 1;
          wrote = (size_t *)((long)wrote + -1);
        }
        *(undefined4 *)&k->maxdownload = 4;
      }
      else {
        *(undefined4 *)&k->maxdownload = 5;
      }
    }
  } while( true );
}

Assistant:

CHUNKcode Curl_httpchunk_read(struct Curl_easy *data,
                              char *datap,
                              ssize_t datalen,
                              ssize_t *wrotep,
                              CURLcode *extrap)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct Curl_chunker *ch = &conn->chunk;
  struct SingleRequest *k = &data->req;
  size_t piece;
  curl_off_t length = (curl_off_t)datalen;
  size_t *wrote = (size_t *)wrotep;

  *wrote = 0; /* nothing's written yet */

  /* the original data is written to the client, but we go on with the
     chunk read process, to properly calculate the content length*/
  if(data->set.http_te_skip && !k->ignorebody) {
    result = Curl_client_write(data, CLIENTWRITE_BODY, datap, datalen);
    if(result) {
      *extrap = result;
      return CHUNKE_PASSTHRU_ERROR;
    }
  }

  while(length) {
    switch(ch->state) {
    case CHUNK_HEX:
      if(isxdigit_ascii(*datap)) {
        if(ch->hexindex < CHUNK_MAXNUM_LEN) {
          ch->hexbuffer[ch->hexindex] = *datap;
          datap++;
          length--;
          ch->hexindex++;
        }
        else {
          return CHUNKE_TOO_LONG_HEX; /* longer hex than we support */
        }
      }
      else {
        char *endptr;
        if(0 == ch->hexindex)
          /* This is illegal data, we received junk where we expected
             a hexadecimal digit. */
          return CHUNKE_ILLEGAL_HEX;

        /* length and datap are unmodified */
        ch->hexbuffer[ch->hexindex] = 0;

        /* convert to host encoding before calling strtoul */
        result = Curl_convert_from_network(data, ch->hexbuffer, ch->hexindex);
        if(result) {
          /* Curl_convert_from_network calls failf if unsuccessful */
          /* Treat it as a bad hex character */
          return CHUNKE_ILLEGAL_HEX;
        }

        if(curlx_strtoofft(ch->hexbuffer, &endptr, 16, &ch->datasize))
          return CHUNKE_ILLEGAL_HEX;
        ch->state = CHUNK_LF; /* now wait for the CRLF */
      }
      break;

    case CHUNK_LF:
      /* waiting for the LF after a chunk size */
      if(*datap == 0x0a) {
        /* we're now expecting data to come, unless size was zero! */
        if(0 == ch->datasize) {
          ch->state = CHUNK_TRAILER; /* now check for trailers */
        }
        else
          ch->state = CHUNK_DATA;
      }

      datap++;
      length--;
      break;

    case CHUNK_DATA:
      /* We expect 'datasize' of data. We have 'length' right now, it can be
         more or less than 'datasize'. Get the smallest piece.
      */
      piece = curlx_sotouz((ch->datasize >= length)?length:ch->datasize);

      /* Write the data portion available */
      if(!data->set.http_te_skip && !k->ignorebody) {
        if(!data->set.http_ce_skip && k->writer_stack)
          result = Curl_unencode_write(data, k->writer_stack, datap, piece);
        else
          result = Curl_client_write(data, CLIENTWRITE_BODY, datap, piece);

        if(result) {
          *extrap = result;
          return CHUNKE_PASSTHRU_ERROR;
        }
      }

      *wrote += piece;
      ch->datasize -= piece; /* decrease amount left to expect */
      datap += piece;    /* move read pointer forward */
      length -= piece;   /* decrease space left in this round */

      if(0 == ch->datasize)
        /* end of data this round, we now expect a trailing CRLF */
        ch->state = CHUNK_POSTLF;
      break;

    case CHUNK_POSTLF:
      if(*datap == 0x0a) {
        /* The last one before we go back to hex state and start all over. */
        Curl_httpchunk_init(data); /* sets state back to CHUNK_HEX */
      }
      else if(*datap != 0x0d)
        return CHUNKE_BAD_CHUNK;
      datap++;
      length--;
      break;

    case CHUNK_TRAILER:
      if((*datap == 0x0d) || (*datap == 0x0a)) {
        char *tr = Curl_dyn_ptr(&conn->trailer);
        /* this is the end of a trailer, but if the trailer was zero bytes
           there was no trailer and we move on */

        if(tr) {
          size_t trlen;
          result = Curl_dyn_add(&conn->trailer, (char *)"\x0d\x0a");
          if(result)
            return CHUNKE_OUT_OF_MEMORY;

          tr = Curl_dyn_ptr(&conn->trailer);
          trlen = Curl_dyn_len(&conn->trailer);
          /* Convert to host encoding before calling Curl_client_write */
          result = Curl_convert_from_network(data, tr, trlen);
          if(result)
            /* Curl_convert_from_network calls failf if unsuccessful */
            /* Treat it as a bad chunk */
            return CHUNKE_BAD_CHUNK;

          if(!data->set.http_te_skip) {
            result = Curl_client_write(data, CLIENTWRITE_HEADER, tr, trlen);
            if(result) {
              *extrap = result;
              return CHUNKE_PASSTHRU_ERROR;
            }
          }
          Curl_dyn_reset(&conn->trailer);
          ch->state = CHUNK_TRAILER_CR;
          if(*datap == 0x0a)
            /* already on the LF */
            break;
        }
        else {
          /* no trailer, we're on the final CRLF pair */
          ch->state = CHUNK_TRAILER_POSTCR;
          break; /* don't advance the pointer */
        }
      }
      else {
        result = Curl_dyn_addn(&conn->trailer, datap, 1);
        if(result)
          return CHUNKE_OUT_OF_MEMORY;
      }
      datap++;
      length--;
      break;

    case CHUNK_TRAILER_CR:
      if(*datap == 0x0a) {
        ch->state = CHUNK_TRAILER_POSTCR;
        datap++;
        length--;
      }
      else
        return CHUNKE_BAD_CHUNK;
      break;

    case CHUNK_TRAILER_POSTCR:
      /* We enter this state when a CR should arrive so we expect to
         have to first pass a CR before we wait for LF */
      if((*datap != 0x0d) && (*datap != 0x0a)) {
        /* not a CR then it must be another header in the trailer */
        ch->state = CHUNK_TRAILER;
        break;
      }
      if(*datap == 0x0d) {
        /* skip if CR */
        datap++;
        length--;
      }
      /* now wait for the final LF */
      ch->state = CHUNK_STOP;
      break;

    case CHUNK_STOP:
      if(*datap == 0x0a) {
        length--;

        /* Record the length of any data left in the end of the buffer
           even if there's no more chunks to read */
        ch->datasize = curlx_sotouz(length);

        return CHUNKE_STOP; /* return stop */
      }
      else
        return CHUNKE_BAD_CHUNK;
    }
  }
  return CHUNKE_OK;
}